

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O3

Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readAnyValue_abi_cxx11_
          (Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_type *psVar4;
  _Rb_tree_color _Var5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Base_ptr *pp_Var8;
  YamlEvent event_1;
  YamlEvent event;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result_1;
  int local_154;
  undefined1 local_148 [16];
  undefined1 local_138 [24];
  _Base_ptr local_120;
  bool local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ParserContext *local_e8;
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  bool local_b8;
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_98;
  bool local_88 [8];
  _Rb_tree_node_base local_80;
  _Base_ptr local_60;
  vector<yaml::Value,_std::allocator<yaml::Value>_> vStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  size_type *local_38;
  
  local_38 = &(__return_storage_ptr__->field_0).value_.string_._M_string_length;
  local_40 = &aStack_98;
  local_154 = 0;
  local_e8 = this;
  do {
    psVar4 = local_38;
    if (local_154 == 2) {
      getNextEvent_abi_cxx11_
                ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e0,local_e8);
      uVar3 = aStack_c8._0_8_;
      uVar2 = local_e0._16_8_;
      if (local_b8 == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,"Error while reading mapping: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        if ((undefined1 *)local_148._0_8_ == local_148 + 0x10) {
          local_b0._16_8_ = local_138._0_8_;
          aStack_98._M_allocated_capacity = local_138._8_8_;
          _Var6._M_p = (pointer)(local_b0 + 0x10);
        }
        else {
          local_b0._0_8_ = local_148._0_8_;
          local_b0._16_8_ = local_138._0_8_;
          _Var6._M_p = (pointer)local_148._0_8_;
        }
        local_b0._16_8_ = local_138._0_8_;
        *(size_type **)&__return_storage_ptr__->field_0 = psVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_b0 + 0x10)) {
          *psVar4 = local_138._0_8_;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(psVar4 + 1))->_M_allocated_capacity = aStack_98._M_allocated_capacity;
        }
        else {
          *(pointer *)&__return_storage_ptr__->field_0 = _Var6._M_p;
          (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_138._0_8_;
        }
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_148._8_8_;
        __return_storage_ptr__->has_value_ = false;
      }
      else {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_100 + 8);
        local_110._0_4_ = local_e0._0_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._8_8_ == &aStack_c8) {
          uStack_f0 = aStack_c8._8_4_;
          uStack_ec = aStack_c8._12_4_;
          local_e0._8_8_ = paVar7;
        }
        local_100._8_8_ = aStack_c8._0_8_;
        local_100._0_8_ = local_e0._16_8_;
        local_e0._16_8_ = 0;
        aStack_c8._0_8_ = aStack_c8._0_8_ & 0xffffffffffffff00;
        local_110._8_8_ = local_e0._8_8_;
        if (local_e0._0_4_ == YAML_MAPPING_START_EVENT) {
          local_e0._8_8_ = &aStack_c8;
          readMapping_abi_cxx11_
                    ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_148,local_e8);
          if (local_118 == false) {
            local_b0._0_8_ = local_b0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b0,local_148._0_8_,
                       (pointer)(local_148._8_8_ + local_148._0_8_));
            *(size_type **)&__return_storage_ptr__->field_0 = psVar4;
            if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
              *psVar4 = local_b0._16_8_;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(psVar4 + 1))->_M_allocated_capacity = aStack_98._M_allocated_capacity;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   (pointer)local_b0._0_8_;
              (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_b0._16_8_;
            }
            (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p =
                 (pointer)local_b0._8_8_;
            __return_storage_ptr__->has_value_ = false;
          }
          else {
            local_b0._0_4_ = 1;
            local_b0._16_8_ = 0;
            aStack_98._M_allocated_capacity = aStack_98._M_allocated_capacity & 0xffffffffffffff00;
            local_80._M_left = (_Base_ptr)(local_88 + 8);
            if (local_138._0_8_ == 0) {
              pp_Var8 = &local_60;
              local_80._M_parent = (_Base_ptr)0x0;
              _Var5 = _S_red;
              local_80._M_right = local_80._M_left;
            }
            else {
              local_80._M_parent = (_Base_ptr)local_138._0_8_;
              *(_Base_ptr *)(local_138._0_8_ + 8) = local_80._M_left;
              pp_Var8 = &local_120;
              local_60 = local_120;
              local_138._0_8_ = 0;
              local_80._M_left = (_Base_ptr)local_138._8_8_;
              local_80._M_right = (_Base_ptr)local_138._16_8_;
              _Var5 = local_148._8_4_;
              local_138._8_8_ = (_Base_ptr)(local_148 + 8);
              local_138._16_8_ = (_Base_ptr)(local_148 + 8);
            }
            local_b0._8_8_ = &aStack_98;
            *pp_Var8 = (_Base_ptr)0x0;
            vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_80._M_color = _Var5;
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(Value *)local_b0);
            std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&vStack_58);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                         *)local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._8_8_ != &aStack_98) {
              operator_delete((void *)local_b0._8_8_,(ulong)(aStack_98._M_allocated_capacity + 1));
            }
          }
          Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_148);
        }
        else if (local_e0._0_4_ == YAML_SEQUENCE_START_EVENT) {
          local_e0._8_8_ = &aStack_c8;
          readSequence_abi_cxx11_
                    ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_148,local_e8);
          if ((bool)local_138[0x10] == false) {
            local_b0._0_8_ = local_b0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b0,local_148._0_8_,
                       (pointer)(local_148._8_8_ + local_148._0_8_));
            *(size_type **)&__return_storage_ptr__->field_0 = psVar4;
            if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
              *psVar4 = local_b0._16_8_;
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(psVar4 + 1))->_M_allocated_capacity = aStack_98._M_allocated_capacity;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   (pointer)local_b0._0_8_;
              (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_b0._16_8_;
            }
            (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p =
                 (pointer)local_b0._8_8_;
            __return_storage_ptr__->has_value_ = false;
          }
          else {
            local_b0._0_4_ = 2;
            local_b0._16_8_ = 0;
            aStack_98._M_allocated_capacity = aStack_98._M_allocated_capacity & 0xffffffffffffff00;
            local_80._M_left = (_Base_ptr)(local_88 + 8);
            local_80._M_color = _S_red;
            local_80._M_parent = (_Base_ptr)0x0;
            local_60 = (_Base_ptr)0x0;
            vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
            vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
            vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_138._0_8_;
            local_148._0_8_ = (pointer)0x0;
            local_148._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_138._0_8_ = 0;
            local_b0._8_8_ = &aStack_98;
            local_80._M_right = local_80._M_left;
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(Value *)local_b0);
            std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&vStack_58);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                         *)local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._8_8_ != &aStack_98) {
              operator_delete((void *)local_b0._8_8_,(ulong)(aStack_98._M_allocated_capacity + 1));
            }
          }
          Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_148);
        }
        else if (local_e0._0_4_ == YAML_SCALAR_EVENT) {
          local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
          local_b0._8_8_ = local_e0._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._8_8_ == paVar7) {
            aStack_98._8_8_ = CONCAT44(uStack_ec,uStack_f0);
            local_b0._8_8_ = &aStack_98;
          }
          aStack_98._M_allocated_capacity = uVar3;
          local_80._M_left = (_Base_ptr)(local_88 + 8);
          local_b0._16_8_ = uVar2;
          local_100._0_8_ = 0;
          local_100._8_8_ = uVar3 & 0xffffffffffffff00;
          local_80._M_color = _S_red;
          local_80._M_parent = (_Base_ptr)0x0;
          local_60 = (_Base_ptr)0x0;
          vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_58.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_110._8_8_ = paVar7;
          local_e0._8_8_ = &aStack_c8;
          local_80._M_right = local_80._M_left;
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(Value *)local_b0);
          std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&vStack_58);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                       *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._8_8_ != &aStack_98) {
            operator_delete((void *)local_b0._8_8_,(ulong)(aStack_98._M_allocated_capacity + 1));
          }
        }
        else {
          local_e0._8_8_ = &aStack_c8;
          format_abi_cxx11_((string *)local_148,"Unexpected event %d");
          if ((undefined1 *)local_148._0_8_ == local_148 + 0x10) {
            local_b0._16_8_ = local_138._0_8_;
            aStack_98._M_allocated_capacity = local_138._8_8_;
            _Var6._M_p = (pointer)(local_b0 + 0x10);
          }
          else {
            local_b0._0_8_ = local_148._0_8_;
            local_b0._16_8_ = local_138._0_8_;
            _Var6._M_p = (pointer)local_148._0_8_;
          }
          local_b0._16_8_ = local_138._0_8_;
          *(size_type **)&__return_storage_ptr__->field_0 = psVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_b0 + 0x10)) {
            *psVar4 = local_138._0_8_;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(psVar4 + 1))->_M_allocated_capacity = aStack_98._M_allocated_capacity;
          }
          else {
            *(pointer *)&__return_storage_ptr__->field_0 = _Var6._M_p;
            (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_138._0_8_;
          }
          *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_148._8_8_;
          __return_storage_ptr__->has_value_ = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._8_8_ != paVar7) {
          operator_delete((void *)local_110._8_8_,(ulong)(local_100._8_8_ + 1));
        }
      }
      if (local_b8 == true) {
        paVar7 = &aStack_c8;
      }
      else {
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_e0 + 0x10);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar7->_M_allocated_capacity)[-2] == paVar7) {
        return __return_storage_ptr__;
      }
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b0,local_e8);
    if (local_88[0] == false) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "Error while reading mapping: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      if ((undefined1 *)local_e0._0_8_ == local_e0 + 0x10) {
        local_138._8_8_ = aStack_c8._0_8_;
        _Var6._M_p = (pointer)(local_148 + 0x10);
      }
      else {
        local_148._0_8_ = local_e0._0_8_;
        _Var6._M_p = (pointer)local_e0._0_8_;
      }
      local_138._0_8_ = local_e0._16_8_;
      *(size_type **)&__return_storage_ptr__->field_0 = psVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_148 + 0x10)) {
        *psVar4 = local_e0._16_8_;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(psVar4 + 1))->_M_allocated_capacity = local_138._8_8_;
      }
      else {
        *(pointer *)&__return_storage_ptr__->field_0 = _Var6._M_p;
        (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_e0._16_8_;
      }
      (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p = (pointer)local_e0._8_8_;
      __return_storage_ptr__->has_value_ = false;
      bVar1 = false;
    }
    else {
      local_148._0_4_ = local_b0._0_4_;
      local_148._8_8_ = local_138 + 8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._8_8_ == &aStack_98) {
        local_138._16_8_ = aStack_98._8_8_;
      }
      else {
        local_148._8_8_ = local_b0._8_8_;
      }
      local_138._8_8_ = aStack_98._M_allocated_capacity;
      local_138._0_8_ = local_b0._16_8_;
      local_b0._16_8_ = 0;
      aStack_98._M_allocated_capacity = aStack_98._M_allocated_capacity & 0xffffffffffffff00;
      local_b0._8_8_ = &aStack_98;
      if (local_b0._0_4_ == YAML_DOCUMENT_START_EVENT) {
        if (local_154 != 1) {
          local_110._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"Unexpected YAML_DOCUMENT_START_EVENT","");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100) {
            local_e0._16_8_ = local_100._0_8_;
            aStack_c8._0_8_ = local_100._8_8_;
            _Var6._M_p = local_e0 + 0x10;
          }
          else {
            local_e0._0_8_ = local_110._0_8_;
            local_e0._16_8_ = local_100._0_8_;
            _Var6._M_p = (pointer)local_110._0_8_;
          }
          goto LAB_00148111;
        }
        bVar1 = true;
        local_154 = 2;
      }
      else {
        if (local_b0._0_4_ == YAML_STREAM_START_EVENT) {
          if (local_154 == 0) {
            bVar1 = true;
            local_154 = 1;
            goto LAB_00148145;
          }
          local_110._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_100;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_110,"Unexpected YAML_STREAM_START_EVENT","");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100) {
            local_e0._16_8_ = local_100._0_8_;
            aStack_c8._0_8_ = local_100._8_8_;
            _Var6._M_p = (pointer)(local_e0 + 0x10);
          }
          else {
            local_e0._0_8_ = local_110._0_8_;
            local_e0._16_8_ = local_100._0_8_;
            _Var6._M_p = (pointer)local_110._0_8_;
          }
        }
        else {
          format_abi_cxx11_((string *)local_110,"Unexpected event %d");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100) {
            local_e0._16_8_ = local_100._0_8_;
            aStack_c8._0_8_ = local_100._8_8_;
            _Var6._M_p = (pointer)(local_e0 + 0x10);
          }
          else {
            local_e0._0_8_ = local_110._0_8_;
            local_e0._16_8_ = local_100._0_8_;
            _Var6._M_p = (pointer)local_110._0_8_;
          }
        }
LAB_00148111:
        *(size_type **)&__return_storage_ptr__->field_0 = psVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_e0 + 0x10)) {
          *psVar4 = local_e0._16_8_;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(psVar4 + 1))->_M_allocated_capacity = aStack_c8._0_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = _Var6._M_p;
          (__return_storage_ptr__->field_0).value_.string_._M_string_length = local_e0._16_8_;
        }
        (__return_storage_ptr__->field_0).value_.string_._M_dataplus._M_p = (pointer)local_110._8_8_
        ;
        __return_storage_ptr__->has_value_ = false;
        bVar1 = false;
        local_100._0_8_ = local_e0._16_8_;
      }
LAB_00148145:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_138 + 8)) {
        operator_delete((void *)local_148._8_8_,(ulong)(local_138._8_8_ + 1));
      }
    }
    if (local_88[0] == true) {
      paVar7 = &aStack_98;
      _Var6._M_p = (pointer)local_b0._8_8_;
    }
    else {
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_b0 + 0x10);
      _Var6._M_p = (pointer)local_b0._0_8_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p,paVar7->_M_allocated_capacity + 1);
    }
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Expected<Value, std::string> readAnyValue() {
		enum class State {
			Init,
			StreamStarted,
			DocumentStarted,
		};

		for(State state = State::Init; state != State::DocumentStarted;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading mapping: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_STREAM_START_EVENT:
					if (state != State::Init)
						return Unexpected<std::string>("Unexpected YAML_STREAM_START_EVENT");
					state = State::StreamStarted;
					break;
				case YAML_DOCUMENT_START_EVENT:
					if (state != State::StreamStarted)
						return Unexpected<std::string>("Unexpected YAML_DOCUMENT_START_EVENT");
					state = State::DocumentStarted;
					break;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			} // switch (event.type)
		} // for(state != DocumentStarted)

		auto event_result = getNextEvent();
		if (!event_result)
			return Unexpected("Error while reading mapping: " + event_result.error());
		YamlEvent event = std::move(event_result).value();

		switch (event.type) {
			case YAML_SCALAR_EVENT:
				MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
				return Value(std::move(event.value));
			case YAML_SEQUENCE_START_EVENT:
				MSG("YAML_SEQUENCE_START_EVENT");
				{
					auto result = readSequence();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			case YAML_MAPPING_START_EVENT:
				MSG("YAML_MAPPING_START_EVENT");
				{
					auto result = readMapping();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			default:
				return Unexpected(format("Unexpected event %d", event.type));
		}
	}